

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile.hpp
# Opt level: O0

bool __thiscall
ruckig::Profile::
check_for_first_order<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
          (Profile *this,double vUp)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  reference pvVar6;
  reference pvVar7;
  array<double,_8UL> *this_00;
  double extraout_XMM0_Qa;
  double local_138;
  ulong local_118;
  size_t i;
  double local_f8;
  double local_d8;
  undefined1 local_d0 [56];
  double local_98;
  undefined1 local_90 [56];
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  value_type_conflict2 local_40;
  value_type_conflict2 local_38;
  value_type_conflict2 local_30;
  value_type_conflict2 local_28;
  double local_20;
  double vUp_local;
  Profile *this_local;
  
  local_20 = vUp;
  vUp_local = (double)this;
  pvVar6 = std::array<double,_7UL>::operator[](&this->t,3);
  if (0.0 < *pvVar6 || *pvVar6 == 0.0) {
    local_58 = 0;
    local_50 = 0;
    local_48 = 0;
    pvVar6 = std::array<double,_7UL>::operator[](&this->t,3);
    local_40 = *pvVar6;
    pvVar6 = std::array<double,_7UL>::operator[](&this->t,3);
    local_38 = *pvVar6;
    pvVar6 = std::array<double,_7UL>::operator[](&this->t,3);
    local_30 = *pvVar6;
    pvVar6 = std::array<double,_7UL>::operator[](&this->t,3);
    local_28 = *pvVar6;
    memcpy(&this->t_sum,&local_58,0x38);
    pvVar6 = std::array<double,_7UL>::back(&this->t_sum);
    if (*pvVar6 <= 1000000000000.0) {
      memset(local_90,0,0x38);
      memcpy(local_90,&DAT_001624a8,0x38);
      memcpy(&this->j,local_90,0x38);
      memset(local_d0,0,0x40);
      local_98 = this->af;
      memcpy(&this->a,local_d0,0x40);
      memset(&i,0,0x40);
      pvVar6 = std::array<double,_7UL>::operator[](&this->t,3);
      if (*pvVar6 <= 0.0) {
        local_138 = 0.0;
      }
      else {
        local_138 = local_20;
      }
      local_f8 = local_138;
      local_d8 = this->vf;
      memcpy(&this->v,&i,0x40);
      for (local_118 = 0; local_118 < 7; local_118 = local_118 + 1) {
        pvVar7 = std::array<double,_8UL>::operator[](&this->p,local_118);
        dVar1 = *pvVar7;
        pvVar6 = std::array<double,_7UL>::operator[](&this->t,local_118);
        dVar2 = *pvVar6;
        pvVar7 = std::array<double,_8UL>::operator[](&this->v,local_118);
        dVar3 = *pvVar7;
        pvVar6 = std::array<double,_7UL>::operator[](&this->t,local_118);
        dVar4 = *pvVar6;
        pvVar7 = std::array<double,_8UL>::operator[](&this->a,local_118);
        dVar5 = *pvVar7;
        pvVar7 = std::array<double,_8UL>::operator[](&this->p,local_118 + 1);
        *pvVar7 = dVar2 * (dVar3 + (dVar4 * dVar5) / 2.0) + dVar1;
      }
      this->control_signs = UDDU;
      this->limits = NONE;
      this->direction = (uint)(local_20 <= 0.0);
      this_00 = &this->p;
      std::array<double,_8UL>::back(this_00);
      std::abs((int)this_00);
      this_local._7_1_ = extraout_XMM0_Qa < 1e-08;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool check_for_first_order(double vUp) {
        // ReachedLimits::VEL
        if (t[3] < 0.0) {
            return false;
        }

        t_sum = {0, 0, 0, t[3], t[3], t[3], t[3]};
        if (t_sum.back() > t_max) { // For numerical reasons, is that needed?
            return false;
        }

        j = {0, 0, 0, 0, 0, 0, 0};
        a = {0, 0, 0, 0, 0, 0, 0, af};
        v = {0, 0, 0, t[3] > 0 ? vUp : 0, 0, 0, 0, vf};
        for (size_t i = 0; i < 7; ++i) {
            p[i+1] = p[i] + t[i] * (v[i] + t[i] * a[i] / 2);
        }

        this->control_signs = control_signs;
        this->limits = limits;

        direction = (vUp > 0) ? Profile::Direction::UP : Profile::Direction::DOWN;

        return std::abs(p.back() - pf) < p_precision;
    }